

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O0

void PredictLineTop_SSE2(uint8_t *src,uint8_t *pred,uint8_t *dst,int length)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int local_c8;
  __m128i C1;
  __m128i C0;
  __m128i B1;
  __m128i B0;
  __m128i A1;
  __m128i A0;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char cStack_19;
  char cStack_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  int max_pos;
  int i;
  int length_local;
  uint8_t *dst_local;
  
  for (local_c8 = 0; local_c8 < (int)(length & 0xffffffe0U); local_c8 = local_c8 + 0x20) {
    uVar1 = *(undefined8 *)(src + local_c8);
    uVar2 = *(undefined8 *)(src + local_c8 + 8);
    uVar3 = *(undefined8 *)(src + (local_c8 + 0x10));
    uVar4 = *(undefined8 *)(src + (local_c8 + 0x10) + 8);
    uVar5 = *(undefined8 *)(pred + local_c8);
    uVar6 = *(undefined8 *)(pred + local_c8 + 8);
    uVar7 = *(undefined8 *)(pred + (local_c8 + 0x10));
    uVar8 = *(undefined8 *)(pred + (local_c8 + 0x10) + 8);
    cStack_18 = (char)uVar1;
    cStack_17 = (char)((ulong)uVar1 >> 8);
    cStack_16 = (char)((ulong)uVar1 >> 0x10);
    cStack_15 = (char)((ulong)uVar1 >> 0x18);
    max_pos._0_1_ = (char)((ulong)uVar1 >> 0x20);
    max_pos._1_1_ = (char)((ulong)uVar1 >> 0x28);
    max_pos._2_1_ = (char)((ulong)uVar1 >> 0x30);
    max_pos._3_1_ = (char)((ulong)uVar1 >> 0x38);
    i._0_1_ = (char)uVar2;
    i._1_1_ = (char)((ulong)uVar2 >> 8);
    i._2_1_ = (char)((ulong)uVar2 >> 0x10);
    i._3_1_ = (char)((ulong)uVar2 >> 0x18);
    length_local._0_1_ = (char)((ulong)uVar2 >> 0x20);
    length_local._1_1_ = (char)((ulong)uVar2 >> 0x28);
    length_local._2_1_ = (char)((ulong)uVar2 >> 0x30);
    length_local._3_1_ = (char)((ulong)uVar2 >> 0x38);
    A0[1]._0_1_ = (char)uVar5;
    A0[1]._1_1_ = (char)((ulong)uVar5 >> 8);
    A0[1]._2_1_ = (char)((ulong)uVar5 >> 0x10);
    A0[1]._3_1_ = (char)((ulong)uVar5 >> 0x18);
    A0[1]._4_1_ = (char)((ulong)uVar5 >> 0x20);
    A0[1]._5_1_ = (char)((ulong)uVar5 >> 0x28);
    A0[1]._6_1_ = (char)((ulong)uVar5 >> 0x30);
    A0[1]._7_1_ = (char)((ulong)uVar5 >> 0x38);
    cStack_20 = (char)uVar6;
    cStack_1f = (char)((ulong)uVar6 >> 8);
    cStack_1e = (char)((ulong)uVar6 >> 0x10);
    cStack_1d = (char)((ulong)uVar6 >> 0x18);
    cStack_1c = (char)((ulong)uVar6 >> 0x20);
    cStack_1b = (char)((ulong)uVar6 >> 0x28);
    cStack_1a = (char)((ulong)uVar6 >> 0x30);
    cStack_19 = (char)((ulong)uVar6 >> 0x38);
    A1[1]._0_1_ = (char)uVar3;
    A1[1]._1_1_ = (char)((ulong)uVar3 >> 8);
    A1[1]._2_1_ = (char)((ulong)uVar3 >> 0x10);
    A1[1]._3_1_ = (char)((ulong)uVar3 >> 0x18);
    A1[1]._4_1_ = (char)((ulong)uVar3 >> 0x20);
    A1[1]._5_1_ = (char)((ulong)uVar3 >> 0x28);
    A1[1]._6_1_ = (char)((ulong)uVar3 >> 0x30);
    A1[1]._7_1_ = (char)((ulong)uVar3 >> 0x38);
    A0[0]._0_1_ = (char)uVar4;
    A0[0]._1_1_ = (char)((ulong)uVar4 >> 8);
    A0[0]._2_1_ = (char)((ulong)uVar4 >> 0x10);
    A0[0]._3_1_ = (char)((ulong)uVar4 >> 0x18);
    A0[0]._4_1_ = (char)((ulong)uVar4 >> 0x20);
    A0[0]._5_1_ = (char)((ulong)uVar4 >> 0x28);
    A0[0]._6_1_ = (char)((ulong)uVar4 >> 0x30);
    A0[0]._7_1_ = (char)((ulong)uVar4 >> 0x38);
    B0[1]._0_1_ = (char)uVar7;
    B0[1]._1_1_ = (char)((ulong)uVar7 >> 8);
    B0[1]._2_1_ = (char)((ulong)uVar7 >> 0x10);
    B0[1]._3_1_ = (char)((ulong)uVar7 >> 0x18);
    B0[1]._4_1_ = (char)((ulong)uVar7 >> 0x20);
    B0[1]._5_1_ = (char)((ulong)uVar7 >> 0x28);
    B0[1]._6_1_ = (char)((ulong)uVar7 >> 0x30);
    B0[1]._7_1_ = (char)((ulong)uVar7 >> 0x38);
    A1[0]._0_1_ = (char)uVar8;
    A1[0]._1_1_ = (char)((ulong)uVar8 >> 8);
    A1[0]._2_1_ = (char)((ulong)uVar8 >> 0x10);
    A1[0]._3_1_ = (char)((ulong)uVar8 >> 0x18);
    A1[0]._4_1_ = (char)((ulong)uVar8 >> 0x20);
    A1[0]._5_1_ = (char)((ulong)uVar8 >> 0x28);
    A1[0]._6_1_ = (char)((ulong)uVar8 >> 0x30);
    A1[0]._7_1_ = (char)((ulong)uVar8 >> 0x38);
    *(ulong *)(dst + local_c8) =
         CONCAT17(max_pos._3_1_ - A0[1]._7_1_,
                  CONCAT16(max_pos._2_1_ - A0[1]._6_1_,
                           CONCAT15(max_pos._1_1_ - A0[1]._5_1_,
                                    CONCAT14((char)max_pos - A0[1]._4_1_,
                                             CONCAT13(cStack_15 - A0[1]._3_1_,
                                                      CONCAT12(cStack_16 - A0[1]._2_1_,
                                                               CONCAT11(cStack_17 - A0[1]._1_1_,
                                                                        cStack_18 - (char)A0[1])))))
                          ));
    *(ulong *)(dst + local_c8 + 8) =
         CONCAT17(length_local._3_1_ - cStack_19,
                  CONCAT16(length_local._2_1_ - cStack_1a,
                           CONCAT15(length_local._1_1_ - cStack_1b,
                                    CONCAT14((char)length_local - cStack_1c,
                                             CONCAT13(i._3_1_ - cStack_1d,
                                                      CONCAT12(i._2_1_ - cStack_1e,
                                                               CONCAT11(i._1_1_ - cStack_1f,
                                                                        (char)i - cStack_20)))))));
    *(ulong *)(dst + (local_c8 + 0x10)) =
         CONCAT17(A1[1]._7_1_ - B0[1]._7_1_,
                  CONCAT16(A1[1]._6_1_ - B0[1]._6_1_,
                           CONCAT15(A1[1]._5_1_ - B0[1]._5_1_,
                                    CONCAT14(A1[1]._4_1_ - B0[1]._4_1_,
                                             CONCAT13(A1[1]._3_1_ - B0[1]._3_1_,
                                                      CONCAT12(A1[1]._2_1_ - B0[1]._2_1_,
                                                               CONCAT11(A1[1]._1_1_ - B0[1]._1_1_,
                                                                        (char)A1[1] - (char)B0[1])))
                                            ))));
    *(ulong *)(dst + (local_c8 + 0x10) + 8) =
         CONCAT17(A0[0]._7_1_ - A1[0]._7_1_,
                  CONCAT16(A0[0]._6_1_ - A1[0]._6_1_,
                           CONCAT15(A0[0]._5_1_ - A1[0]._5_1_,
                                    CONCAT14(A0[0]._4_1_ - A1[0]._4_1_,
                                             CONCAT13(A0[0]._3_1_ - A1[0]._3_1_,
                                                      CONCAT12(A0[0]._2_1_ - A1[0]._2_1_,
                                                               CONCAT11(A0[0]._1_1_ - A1[0]._1_1_,
                                                                        (char)A0[0] - (char)A1[0])))
                                            ))));
  }
  for (; local_c8 < length; local_c8 = local_c8 + 1) {
    dst[local_c8] = src[local_c8] - pred[local_c8];
  }
  return;
}

Assistant:

static void PredictLineTop_SSE2(const uint8_t* WEBP_RESTRICT src,
                                const uint8_t* WEBP_RESTRICT pred,
                                uint8_t* WEBP_RESTRICT dst, int length) {
  int i;
  const int max_pos = length & ~31;
  assert(length >= 0);
  for (i = 0; i < max_pos; i += 32) {
    const __m128i A0 = _mm_loadu_si128((const __m128i*)&src[i +  0]);
    const __m128i A1 = _mm_loadu_si128((const __m128i*)&src[i + 16]);
    const __m128i B0 = _mm_loadu_si128((const __m128i*)&pred[i +  0]);
    const __m128i B1 = _mm_loadu_si128((const __m128i*)&pred[i + 16]);
    const __m128i C0 = _mm_sub_epi8(A0, B0);
    const __m128i C1 = _mm_sub_epi8(A1, B1);
    _mm_storeu_si128((__m128i*)&dst[i +  0], C0);
    _mm_storeu_si128((__m128i*)&dst[i + 16], C1);
  }
  for (; i < length; ++i) dst[i] = src[i] - pred[i];
}